

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

String __thiscall
testing::internal::XmlUnitTestResultPrinter::EscapeXml
          (XmlUnitTestResultPrinter *this,char *str,bool is_attribute)

{
  byte bVar1;
  void *pvVar2;
  uint uVar3;
  undefined7 in_register_00000011;
  long lVar4;
  size_t extraout_RDX;
  char cVar6;
  ulong uVar7;
  char *pcVar8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar9;
  ostream *poVar10;
  size_t sVar11;
  String SVar12;
  String local_58;
  uint local_44;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  Message m;
  size_t sVar5;
  
  uVar7 = CONCAT71(in_register_00000011,is_attribute) & 0xffffffff;
  Message::Message((Message *)&local_40);
  if (str == (char *)0x0) {
LAB_00125f2d:
    SVar12 = StringStreamToString((internal *)this,local_40.ptr_);
    sVar5 = SVar12.length_;
    if (local_40.ptr_ != (stringstream *)0x0) {
      (**(code **)(*(long *)local_40.ptr_ + 8))();
      sVar5 = extraout_RDX;
    }
    SVar12.length_ = sVar5;
    SVar12.c_str_ = (char *)this;
    return SVar12;
  }
  local_44 = (uint)CONCAT71(in_register_00000011,is_attribute);
  do {
    bVar1 = *str;
    uVar3 = (uint)bVar1;
    cVar6 = (char)uVar7;
    if (bVar1 < 0x27) {
      if (bVar1 == 0x22) {
        sVar9.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_40.ptr_ + 0x10);
        if (local_40.ptr_ ==
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          sVar9.ptr_ = local_40.ptr_;
        }
        lVar4 = 6;
        if (cVar6 != '\0') {
          pcVar8 = "&quot;";
          goto LAB_00125dec;
        }
        local_58.c_str_._0_1_ = 0x22;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)sVar9.ptr_,(char *)&local_58,1);
      }
      else {
        if (uVar3 == 0x26) {
          sVar9.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_40.ptr_ + 0x10);
          if (local_40.ptr_ ==
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            sVar9.ptr_ = local_40.ptr_;
          }
          lVar4 = 5;
          pcVar8 = "&amp;";
          goto LAB_00125dec;
        }
        if (uVar3 == 0) goto LAB_00125f2d;
LAB_00125e01:
        if (('\x1f' < (char)bVar1) || ((uVar3 < 0xe && ((0x2600U >> (uVar3 & 0x1f) & 1) != 0)))) {
          if ((cVar6 == '\0') || ((0xd < uVar3 || ((0x2600U >> (uVar3 & 0x1f) & 1) == 0)))) {
            poVar10 = (ostream *)(local_40.ptr_ + 0x10);
            if (local_40.ptr_ ==
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              poVar10 = (ostream *)0x0;
            }
            local_58.c_str_._0_1_ = bVar1;
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&local_58,1);
          }
          else {
            String::Format(&local_58,"&#x%02X;",(ulong)(uint)(int)(char)bVar1);
            sVar5 = local_58.length_;
            poVar10 = (ostream *)(local_40.ptr_ + 0x10);
            if (local_40.ptr_ ==
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              poVar10 = (ostream *)0x0;
            }
            pvVar2 = (void *)CONCAT71(local_58.c_str_._1_7_,(byte)local_58.c_str_);
            if (pvVar2 == (void *)0x0) {
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(null)",6);
            }
            else if (local_58.length_ != 0) {
              sVar11 = 0;
              do {
                if (*(char *)((long)pvVar2 + sVar11) == '\0') {
                  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\\0",2);
                }
                else {
                  m.ss_.ptr_._7_1_ = *(char *)((long)pvVar2 + sVar11);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar10,(char *)((long)&m.ss_.ptr_ + 7),1);
                }
                sVar11 = sVar11 + 1;
              } while (sVar5 != sVar11);
            }
            if (pvVar2 != (void *)0x0) {
              operator_delete__(pvVar2);
            }
            uVar7 = (ulong)local_44;
          }
        }
      }
    }
    else {
      if (bVar1 == 0x27) {
        sVar9.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_40.ptr_ + 0x10);
        if (local_40.ptr_ ==
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          sVar9.ptr_ = local_40.ptr_;
        }
        lVar4 = 6;
        if (cVar6 == '\0') {
          local_58.c_str_._0_1_ = 0x27;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)sVar9.ptr_,(char *)&local_58,1);
          goto LAB_00125df1;
        }
        pcVar8 = "&apos;";
      }
      else if (uVar3 == 0x3e) {
        sVar9.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_40.ptr_ + 0x10);
        if (local_40.ptr_ ==
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          sVar9.ptr_ = local_40.ptr_;
        }
        lVar4 = 4;
        pcVar8 = "&gt;";
      }
      else {
        if (uVar3 != 0x3c) goto LAB_00125e01;
        sVar9.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_40.ptr_ + 0x10);
        if (local_40.ptr_ ==
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          sVar9.ptr_ = local_40.ptr_;
        }
        lVar4 = 4;
        pcVar8 = "&lt;";
      }
LAB_00125dec:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)sVar9.ptr_,pcVar8,lVar4);
    }
LAB_00125df1:
    str = (char *)((byte *)str + 1);
  } while( true );
}

Assistant:

String XmlUnitTestResultPrinter::EscapeXml(const char* str, bool is_attribute) {
  Message m;

  if (str != NULL) {
    for (const char* src = str; *src; ++src) {
      switch (*src) {
        case '<':
          m << "&lt;";
          break;
        case '>':
          m << "&gt;";
          break;
        case '&':
          m << "&amp;";
          break;
        case '\'':
          if (is_attribute)
            m << "&apos;";
          else
            m << '\'';
          break;
        case '"':
          if (is_attribute)
            m << "&quot;";
          else
            m << '"';
          break;
        default:
          if (IsValidXmlCharacter(*src)) {
            if (is_attribute && IsNormalizableWhitespace(*src))
              m << String::Format("&#x%02X;", unsigned(*src));
            else
              m << *src;
          }
          break;
      }
    }
  }

  return m.GetString();
}